

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistItemSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistWeightSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,DistWeightSyntax **args_1)

{
  DistWeightSyntax *pDVar1;
  DistItemSyntax *pDVar2;
  
  pDVar2 = (DistItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DistItemSyntax *)this->endPtr < pDVar2 + 1) {
    pDVar2 = (DistItemSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pDVar2 + 1);
  }
  pDVar1 = *args_1;
  (pDVar2->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar2->super_SyntaxNode).kind = DistItem;
  (pDVar2->range).ptr = args;
  pDVar2->weight = pDVar1;
  (args->super_SyntaxNode).parent = &pDVar2->super_SyntaxNode;
  if (pDVar1 != (DistWeightSyntax *)0x0) {
    (pDVar1->super_SyntaxNode).parent = &pDVar2->super_SyntaxNode;
  }
  return pDVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }